

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

Result<void> * init::SetLoggingLevel(Result<void> *__return_storage_ptr__,ArgsManager *args)

{
  bool bVar1;
  size_type sVar2;
  Logger *pLVar3;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pointer this;
  long in_FS_OFFSET;
  string_view category_str;
  string_view level_str;
  string_view str;
  string_view level_str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  pointer local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  string local_138;
  bilingual_str local_118;
  string local_d8;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"-loglevel",(allocator<char> *)&local_d8);
  bVar1 = ArgsManager::IsArgSet(args,&local_b8.original);
  std::__cxx11::string::~string((string *)&local_b8);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"-loglevel",(allocator<char> *)&local_d8);
    ArgsManager::GetArgs(&local_150,args,&local_b8.original);
    std::__cxx11::string::~string((string *)&local_b8);
    for (this = local_150.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        this != local_150.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (this,':',3);
      if (sVar2 != 0xffffffffffffffff) {
        str._M_str = (char *)0x3a;
        str._M_len = (size_t)(this->_M_dataplus)._M_p;
        util::SplitString_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffe98,(util *)this->_M_string_length,str,(char)in_R8);
        if ((long)local_160 - (long)in_stack_fffffffffffffe98 == 0x40) {
          pLVar3 = LogInstance();
          in_R8 = in_stack_fffffffffffffe98[1]._M_dataplus._M_p;
          category_str._M_str = (in_stack_fffffffffffffe98->_M_dataplus)._M_p;
          category_str._M_len = in_stack_fffffffffffffe98->_M_string_length;
          level_str_00._M_str = in_R8;
          level_str_00._M_len = in_stack_fffffffffffffe98[1]._M_string_length;
          bVar1 = BCLog::Logger::SetCategoryLogLevel(pLVar3,category_str,level_str_00);
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack0xfffffffffffffe98);
            goto LAB_00a88502;
          }
        }
        _(&local_b8,(ConstevalStringLiteral)0xe3ac30);
        pLVar3 = LogInstance();
        BCLog::Logger::LogCategoriesString_abi_cxx11_(&local_d8,pLVar3);
        pLVar3 = LogInstance();
        BCLog::Logger::LogLevelsString_abi_cxx11_(&local_138,pLVar3);
        tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_118,(tinyformat *)&local_b8,(bilingual_str *)"-loglevel",
                   (char (*) [10])this,&local_d8,&local_138,in_stack_fffffffffffffe98);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_118);
        bilingual_str::~bilingual_str(&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_d8);
        bilingual_str::~bilingual_str(&local_b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffe98);
LAB_00a88651:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_150);
        goto LAB_00a8865b;
      }
      pLVar3 = LogInstance();
      level_str._M_str = (this->_M_dataplus)._M_p;
      level_str._M_len = this->_M_string_length;
      bVar1 = BCLog::Logger::SetLogLevel(pLVar3,level_str);
      if (!bVar1) {
        _(&local_b8,(ConstevalStringLiteral)0xe3abf6);
        pLVar3 = LogInstance();
        BCLog::Logger::LogLevelsString_abi_cxx11_(&local_d8,pLVar3);
        tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                  (&local_78,(tinyformat *)&local_b8,(bilingual_str *)"-loglevel",
                   (char (*) [10])this,&local_d8,in_R9);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_78);
        bilingual_str::~bilingual_str(&local_78);
        std::__cxx11::string::~string((string *)&local_d8);
        bilingual_str::~bilingual_str(&local_b8);
        goto LAB_00a88651;
      }
LAB_00a88502:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_150);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
           super__Move_assign_alias<bilingual_str,_std::monostate>.
           super__Copy_assign_alias<bilingual_str,_std::monostate>.
           super__Move_ctor_alias<bilingual_str,_std::monostate>.
           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
LAB_00a8865b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> SetLoggingLevel(const ArgsManager& args)
{
    if (args.IsArgSet("-loglevel")) {
        for (const std::string& level_str : args.GetArgs("-loglevel")) {
            if (level_str.find_first_of(':', 3) == std::string::npos) {
                // user passed a global log level, i.e. -loglevel=<level>
                if (!LogInstance().SetLogLevel(level_str)) {
                    return util::Error{strprintf(_("Unsupported global logging level %s=%s. Valid values: %s."), "-loglevel", level_str, LogInstance().LogLevelsString())};
                }
            } else {
                // user passed a category-specific log level, i.e. -loglevel=<category>:<level>
                const auto& toks = SplitString(level_str, ':');
                if (!(toks.size() == 2 && LogInstance().SetCategoryLogLevel(toks[0], toks[1]))) {
                    return util::Error{strprintf(_("Unsupported category-specific logging level %1$s=%2$s. Expected %1$s=<category>:<loglevel>. Valid categories: %3$s. Valid loglevels: %4$s."), "-loglevel", level_str, LogInstance().LogCategoriesString(), LogInstance().LogLevelsString())};
                }
            }
        }
    }
    return {};
}